

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O1

int arkLsDenseDQJac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,ARKodeMem ark_mem,
                   ARKLsMem arkls_mem,ARKRhsFn fi,N_Vector tmp1)

{
  double dVar1;
  int iVar2;
  sunindextype sVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  sunrealtype *psVar7;
  long j;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double local_b0;
  long local_a8;
  
  sVar3 = SUNDenseMatrix_Columns(Jac);
  uVar4 = N_VCloneEmpty(tmp1);
  lVar5 = N_VGetArrayPointer(ark_mem->ewt);
  lVar6 = N_VGetArrayPointer(y);
  if (ark_mem->constraintsSet == 0) {
    local_a8 = 0;
  }
  else {
    local_a8 = N_VGetArrayPointer(ark_mem->constraints);
  }
  dVar8 = ark_mem->uround;
  local_b0 = 0.0;
  if (0.0 < dVar8) {
    if (dVar8 < 0.0) {
      local_b0 = sqrt(dVar8);
    }
    else {
      local_b0 = SQRT(dVar8);
    }
  }
  dVar8 = (double)N_VWrmsNorm(fy,ark_mem->rwt);
  if ((dVar8 != 0.0) || (NAN(dVar8))) {
    dVar8 = dVar8 * (double)sVar3 * ABS(ark_mem->h) * 1000.0 * ark_mem->uround;
  }
  else {
    dVar8 = 1.0;
  }
  if (0 < sVar3) {
    j = 0;
    do {
      psVar7 = SUNDenseMatrix_Column(Jac,j);
      N_VSetArrayPointer(psVar7,uVar4);
      dVar1 = *(double *)(lVar6 + j * 8);
      dVar9 = dVar8 / *(double *)(lVar5 + j * 8);
      dVar11 = ABS(dVar1) * local_b0;
      if (ABS(dVar1) * local_b0 <= dVar9) {
        dVar11 = dVar9;
      }
      if (ark_mem->constraintsSet != 0) {
        dVar9 = *(double *)(local_a8 + j * 8);
        dVar10 = ABS(dVar9);
        if ((dVar10 != 1.0) || (NAN(dVar10))) {
          if ((dVar10 == 2.0) && ((!NAN(dVar10) && ((dVar1 + dVar11) * dVar9 <= 0.0))))
          goto LAB_0013e215;
        }
        else if ((dVar1 + dVar11) * dVar9 < 0.0) {
LAB_0013e215:
          dVar11 = -dVar11;
        }
      }
      *(double *)(lVar6 + j * 8) = dVar1 + dVar11;
      iVar2 = (*fi)(t,y,tmp1,ark_mem->user_data);
      arkls_mem->nfeDQ = arkls_mem->nfeDQ + 1;
      if (iVar2 != 0) goto LAB_0013e2aa;
      *(double *)(lVar6 + j * 8) = dVar1;
      N_VLinearSum(1.0 / dVar11,-(1.0 / dVar11),tmp1,fy,uVar4);
      j = j + 1;
    } while (sVar3 != j);
  }
  iVar2 = 0;
LAB_0013e2aa:
  N_VSetArrayPointer(0,uVar4);
  N_VDestroy(uVar4);
  return iVar2;
}

Assistant:

int arkLsDenseDQJac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
                    ARKodeMem ark_mem, ARKLsMem arkls_mem, ARKRhsFn fi,
                    N_Vector tmp1)
{
  sunrealtype fnorm, minInc, inc, inc_inv, yjsaved, srur, conj;
  sunrealtype *y_data, *ewt_data, *cns_data;
  N_Vector ftemp, jthCol;
  sunindextype j, N;
  int retval = 0;

  /* access matrix dimension */
  N = SUNDenseMatrix_Columns(Jac);

  /* Rename work vector for readibility */
  ftemp = tmp1;

  /* Create an empty vector for matrix column calculations */
  jthCol = N_VCloneEmpty(tmp1);

  /* Obtain pointers to the data for various vectors */
  ewt_data = N_VGetArrayPointer(ark_mem->ewt);
  y_data   = N_VGetArrayPointer(y);
  cns_data = (ark_mem->constraintsSet) ? N_VGetArrayPointer(ark_mem->constraints)
                                       : NULL;

  /* Set minimum increment based on uround and norm of f */
  srur   = SUNRsqrt(ark_mem->uround);
  fnorm  = N_VWrmsNorm(fy, ark_mem->rwt);
  minInc = (fnorm != ZERO)
             ? (MIN_INC_MULT * SUNRabs(ark_mem->h) * ark_mem->uround * N * fnorm)
             : ONE;

  for (j = 0; j < N; j++)
  {
    /* Generate the jth col of J(tn,y) */
    N_VSetArrayPointer(SUNDenseMatrix_Column(Jac, j), jthCol);

    yjsaved = y_data[j];
    inc     = SUNMAX(srur * SUNRabs(yjsaved), minInc / ewt_data[j]);

    /* Adjust sign(inc) if y_j has an inequality constraint. */
    if (ark_mem->constraintsSet)
    {
      conj = cns_data[j];
      if (SUNRabs(conj) == ONE)
      {
        if ((yjsaved + inc) * conj < ZERO) { inc = -inc; }
      }
      else if (SUNRabs(conj) == TWO)
      {
        if ((yjsaved + inc) * conj <= ZERO) { inc = -inc; }
      }
    }

    y_data[j] += inc;

    retval = fi(t, y, ftemp, ark_mem->user_data);
    arkls_mem->nfeDQ++;
    if (retval != 0) { break; }

    y_data[j] = yjsaved;

    inc_inv = ONE / inc;
    N_VLinearSum(inc_inv, ftemp, -inc_inv, fy, jthCol);
  }

  /* Destroy jthCol vector */
  N_VSetArrayPointer(NULL, jthCol); /* SHOULDN'T BE NEEDED */
  N_VDestroy(jthCol);

  return (retval);
}